

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void Print<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *d)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (d->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)d;
      p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_next,(long)p_Var1[1]._M_prev);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void Print(T &d)
{
    for(auto &&e : d)
    {
        cout << e << ",";
    }

    cout << endl;
}